

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeSORegMemOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  switch(Val >> 5 & 3) {
  case 0:
    uVar2 = 0x4000;
    break;
  case 1:
    uVar2 = 0x6000;
    break;
  case 2:
    uVar2 = 0x2000;
    break;
  case 3:
    uVar2 = 0x8000;
    bVar1 = true;
    goto LAB_0014eb7b;
  }
  bVar1 = false;
LAB_0014eb7b:
  uVar3 = Val >> 7 & 0x1f;
  uVar4 = 0xa000;
  if (!bVar1) {
    uVar4 = uVar2;
  }
  if (uVar3 != 0) {
    uVar4 = uVar2;
  }
  MCOperand_CreateReg0(Inst,(uint)*(ushort *)((long)GPRDecoderTable + (ulong)(Val >> 0xc & 0x1e)));
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[Val & 0xf]);
  MCOperand_CreateImm0(Inst,(ulong)((Val & 0x1000 | uVar3 | uVar4) ^ 0x1000));
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeSORegMemOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	ARM_AM_ShiftOpc ShOp;
	unsigned shift;
	unsigned Rn = fieldFromInstruction_4(Val, 13, 4);
	unsigned Rm = fieldFromInstruction_4(Val,  0, 4);
	unsigned type = fieldFromInstruction_4(Val, 5, 2);
	unsigned imm = fieldFromInstruction_4(Val, 7, 5);
	unsigned U = fieldFromInstruction_4(Val, 12, 1);

	ShOp = ARM_AM_lsl;
	switch (type) {
		case 0:
			ShOp = ARM_AM_lsl;
			break;
		case 1:
			ShOp = ARM_AM_lsr;
			break;
		case 2:
			ShOp = ARM_AM_asr;
			break;
		case 3:
			ShOp = ARM_AM_ror;
			break;
	}

	if (ShOp == ARM_AM_ror && imm == 0)
		ShOp = ARM_AM_rrx;

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (U)
		shift = ARM_AM_getAM2Opc(ARM_AM_add, imm, ShOp, 0);
	else
		shift = ARM_AM_getAM2Opc(ARM_AM_sub, imm, ShOp, 0);
	MCOperand_CreateImm0(Inst, shift);

	return S;
}